

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_walk_node.cpp
# Opt level: O0

void __thiscall random_walk_node::reflect(random_walk_node *this,int err)

{
  double dVar1;
  double dVar2;
  double pp;
  double dd;
  int err_local;
  random_walk_node *this_local;
  
  dVar1 = node::getd(&this->super_node);
  dVar2 = node::getp(&this->super_node);
  if (err != (this->super_node).lastErr) {
    if ((err == 1) || (err == 2)) {
      node::setd(&this->super_node,3.141592653589793 - dVar1);
      (this->super_node).lastErr = err;
    }
    else if ((err == 3) || (err == 4)) {
      node::setd(&this->super_node,6.283185307179586 - dVar1);
      (this->super_node).lastErr = err;
    }
    else if ((err == 5) || (err == 6)) {
      (this->super_node).p = 3.141592653589793 - dVar2;
      (this->super_node).lastErr = err;
    }
  }
  return;
}

Assistant:

void random_walk_node::reflect(int err){      //err: 1 XMIN 2 XMAX 3 YMIN 4 YMAX
    double dd = this->getd();
    double pp = this->getp();
    if (err == lastErr) {           //In case random_walk_node reflect forever near an edge
        return;
    }
    if (err ==1 || err == 2) {
        this->setd(M_PI-dd);
        lastErr = err;
    } else if (err ==3 || err ==4) {
        this->setd(2*M_PI-dd);
        lastErr = err;
    } else if (err ==5 || err == 6) {
        this->p = M_PI - pp;
        lastErr = err;

    }
}